

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O0

void __thiscall MatrixProperties::computemuBI(MatrixProperties *this)

{
  element_type *peVar1;
  size_type sVar2;
  allocator_type *__a;
  reference pvVar3;
  ostream *this_00;
  void *this_01;
  vector<double,_std::allocator<double>_> *in_RDI;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int p;
  int q;
  int i;
  double a2;
  double a1;
  double b;
  double steps;
  double interval;
  int n;
  SparseMatrix *M;
  double in_stack_ffffffffffffff58;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff60;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  int local_78;
  int local_74;
  double local_60;
  undefined1 local_31 [49];
  
  local_31._33_8_ =
       std::
       __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_ffffffffffffff60);
  peVar1 = std::
           __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1debd3);
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(peVar1);
  local_31._29_4_ = (undefined4)sVar2;
  peVar1 = std::
           __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1debec);
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(peVar1);
  __a = (allocator_type *)(sVar2 + 1);
  __n = local_31;
  std::allocator<double>::allocator((allocator<double> *)0x1dec0b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(size_type)__n,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)__a,in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
  peVar1 = (element_type *)local_31;
  std::allocator<double>::~allocator((allocator<double> *)0x1dec48);
  in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (local_74 = 0; local_74 < (int)local_31._29_4_; local_74 = local_74 + 1) {
    local_60 = 0.0;
    for (local_78 = 1; (double)local_78 <= 12.0; local_78 = local_78 + 1) {
      for (iVar4 = 1; (double)iVar4 <= 3.0; iVar4 = iVar4 + 1) {
        if (-1 < local_74 - local_78) {
          if (-1 < local_74 - iVar4) {
            peVar1 = (element_type *)local_31._33_8_;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,0x1ded2b);
          }
          if (local_74 + iVar4 < (int)local_31._29_4_) {
            peVar1 = (element_type *)local_31._33_8_;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,0x1ded88);
          }
        }
        if (local_74 + local_78 < (int)local_31._29_4_) {
          if (-1 < local_74 - iVar4) {
            peVar1 = (element_type *)local_31._33_8_;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,0x1dede3);
          }
          if (local_74 + iVar4 < (int)local_31._29_4_) {
            peVar1 = (element_type *)local_31._33_8_;
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,0x1dee21);
          }
        }
        std::abs((int)peVar1);
        in_stack_ffffffffffffff60 = extraout_XMM0_Qa;
        std::abs((int)peVar1);
        local_60 = (double)in_stack_ffffffffffffff60 + extraout_XMM0_Qa_00 + local_60;
      }
    }
    peVar1 = (element_type *)
             &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    in_stack_ffffffffffffff58 = local_60;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)peVar1,(long)local_74);
    *pvVar3 = in_stack_ffffffffffffff58;
    in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(local_60 +
                         (double)in_RDI[3].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
  }
  in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((double)in_RDI[3].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish /
                       (double)(int)local_31._29_4_);
  this_00 = std::operator<<((ostream *)&std::cerr,"Mean Boundary Index is ");
  this_01 = (void *)std::ostream::operator<<
                              (this_00,(double)in_RDI[3].
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_finish);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MatrixProperties::computemuBI() {
    using namespace boost::range;
    // A reference will be easier to work with here
    SparseMatrix& M = *matrix;
    int n = matrix->size1();
    BI = std::vector<double>(matrix->size1()+1);

    double interval = 3;
    double steps = 12;
    double b = 0, a1, a2;
    muBI = 0;
    for (int i=0; i<n; i++) {
        b = 0;
        for (int q=1; q<=steps; q++) {
            for (int p=1; p<=interval; p++){
                a1 = 0;
                a2 = 0;
                if (i-q >= 0) {
                    if (i-p >= 0)
                        a1 = M(i-q, i-p);
                    if (i+p < n)
                        a1 -= M(i-q, i+p);
                }
                if (i+q < n) {
                    if (i-p >= 0)
                        a2 = M(i+q, i-p);
                    if (i+p < n)
                        a2 -= M(i+q, i+p);
                }
                b += abs(a1) + abs(a2);
            }
        }
        BI[i] = b;
        muBI += b;
    }
    muBI /= n;
    cerr << "Mean Boundary Index is " << muBI << endl;
}